

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

void __thiscall RenderTarget::clear(RenderTarget *this)

{
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  pointer ppRVar4;
  ulong uVar5;
  ulong uVar6;
  pointer this_00;
  
  ppRVar4 = (this->objects).
            super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppRVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (ppRVar4[uVar5] != (Renderable *)0x0) {
        (*ppRVar4[uVar5]->_vptr_Renderable[1])();
      }
      ppRVar4 = (this->objects).
                super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar3 = uVar6 < (ulong)((long)(this->objects).
                                    super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar4 >> 3)
      ;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  pPVar1 = (this->programs).super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->programs).super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      nite::Program::~Program(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pPVar2);
    (this->programs).super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar1;
  }
  ppRVar4 = (this->objects).
            super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppRVar4) {
    (this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppRVar4;
  }
  return;
}

Assistant:

void clear(){
		for(unsigned i=0; i<objects.size(); i++){
			//objects[i]->~Renderable();
			delete objects[i];
		}
		programs.clear();
		objects.clear();
	}